

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool pugi::impl::anon_unknown_0::parse_declaration_encoding
               (uint8_t *data,size_t size,uint8_t **out_encoding,size_t *out_length)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  size_t sVar4;
  byte *pbVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (size < 6) {
    return false;
  }
  if (*(int *)data != 0x6d783f3c) {
    return false;
  }
  if (data[4] != 'l') {
    return false;
  }
  if (size < 8 || ((anonymous_namespace)::chartype_table[data[5]] & 8) == 0) {
    return false;
  }
  uVar6 = 0xe;
  do {
    if (data[uVar6 - 8] == 'e') {
      if (data[uVar6 - 7] == 'n') {
        if (size <= uVar6 - 8) {
          return false;
        }
        if (size <= uVar6 - 6) {
          return false;
        }
        if (data[uVar6 - 6] != 'c') {
          return false;
        }
        if (size <= uVar6 - 5) {
          return false;
        }
        if (data[uVar6 - 5] != 'o') {
          return false;
        }
        if (size <= uVar6 - 4) {
          return false;
        }
        if (data[uVar6 - 4] != 'd') {
          return false;
        }
        if (size <= uVar6 - 3) {
          return false;
        }
        if (data[uVar6 - 3] != 'i') {
          return false;
        }
        if (size <= uVar6 - 2) {
          return false;
        }
        if (data[uVar6 - 2] != 'n') {
          return false;
        }
        if (size <= uVar6 - 1) {
          return false;
        }
        if (size <= uVar6 || data[uVar6 - 1] != 'g') {
          return false;
        }
        while (((anonymous_namespace)::chartype_table[data[uVar6]] & 8) != 0) {
          uVar6 = uVar6 + 1;
          if (size <= uVar6) {
            return false;
          }
        }
        if (data[uVar6] != 0x3d) {
          return false;
        }
        uVar6 = uVar6 + 1;
        do {
          if (size <= uVar6) {
            return false;
          }
          bVar2 = data[uVar6];
          uVar6 = uVar6 + 1;
        } while (((anonymous_namespace)::chartype_table[bVar2] & 8) != 0);
        bVar3 = (bVar2 != 0x22) * '\x05' + 0x22;
        if (bVar3 != bVar2) {
          return false;
        }
        *out_encoding = data + uVar6;
        if (uVar6 < size) {
          pbVar5 = data + uVar6;
          sVar4 = 0;
          uVar7 = uVar6;
          do {
            if (((anonymous_namespace)::chartype_table[*pbVar5] & 0x40) == 0) {
              *out_length = sVar4;
              return bVar3 == *pbVar5;
            }
            uVar7 = uVar7 + 1;
            pbVar5 = pbVar5 + 1;
            sVar4 = sVar4 + 1;
          } while (uVar7 < size);
        }
        sVar4 = 0;
        if (uVar6 <= size) {
          sVar4 = size - uVar6;
        }
        *out_length = sVar4;
        return false;
      }
    }
    else if (data[uVar6 - 8] == '?') {
      return false;
    }
    lVar1 = uVar6 - size;
    uVar6 = uVar6 + 1;
    if (lVar1 == 6) {
      return false;
    }
  } while( true );
}

Assistant:

PUGI__FN bool parse_declaration_encoding(const uint8_t* data, size_t size, const uint8_t*& out_encoding, size_t& out_length)
	{
	#define PUGI__SCANCHAR(ch) { if (offset >= size || data[offset] != ch) return false; offset++; }
	#define PUGI__SCANCHARTYPE(ct) { while (offset < size && PUGI__IS_CHARTYPE(data[offset], ct)) offset++; }

		// check if we have a non-empty XML declaration
		if (size < 6 || !((data[0] == '<') & (data[1] == '?') & (data[2] == 'x') & (data[3] == 'm') & (data[4] == 'l') && PUGI__IS_CHARTYPE(data[5], ct_space)))
			return false;

		// scan XML declaration until the encoding field
		for (size_t i = 6; i + 1 < size; ++i)
		{
			// declaration can not contain ? in quoted values
			if (data[i] == '?')
				return false;

			if (data[i] == 'e' && data[i + 1] == 'n')
			{
				size_t offset = i;

				// encoding follows the version field which can't contain 'en' so this has to be the encoding if XML is well formed
				PUGI__SCANCHAR('e'); PUGI__SCANCHAR('n'); PUGI__SCANCHAR('c'); PUGI__SCANCHAR('o');
				PUGI__SCANCHAR('d'); PUGI__SCANCHAR('i'); PUGI__SCANCHAR('n'); PUGI__SCANCHAR('g');

				// S? = S?
				PUGI__SCANCHARTYPE(ct_space);
				PUGI__SCANCHAR('=');
				PUGI__SCANCHARTYPE(ct_space);

				// the only two valid delimiters are ' and "
				uint8_t delimiter = (offset < size && data[offset] == '"') ? '"' : '\'';

				PUGI__SCANCHAR(delimiter);

				size_t start = offset;

				out_encoding = data + offset;

				PUGI__SCANCHARTYPE(ct_symbol);

				out_length = offset - start;

				PUGI__SCANCHAR(delimiter);

				return true;
			}
		}

		return false;

	#undef PUGI__SCANCHAR
	#undef PUGI__SCANCHARTYPE
	}